

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_mod.c
# Opt level: O0

void zzSqrMod(word *b,word *a,word *mod,size_t n,void *stack)

{
  void *in_RDI;
  size_t unaff_retaddr;
  word *sqr;
  
  zzSqr((word *)stack,sqr,unaff_retaddr,in_RDI);
  zzMod(b,a,(size_t)mod,(word *)n,(size_t)stack,sqr);
  return;
}

Assistant:

void zzSqrMod(word b[], const word a[], const word mod[], size_t n,
	void* stack)
{
	word* sqr = (word*)stack;
	stack = sqr + 2 * n;
	ASSERT(wwCmp(a, mod, n) < 0);
	ASSERT(wwIsValid(b, n));
	ASSERT(n > 0 && mod[n - 1] != 0);
	zzSqr(sqr, a, n, stack);
	zzMod(b, sqr, 2 * n, mod, n, stack);
}